

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

FILE * find_in_path(char *name,char *path,char **pfullname)

{
  char *pcVar1;
  size_t sVar2;
  FILE *pFVar3;
  FILE *file;
  char *fullname;
  size_t plen;
  char *npath;
  char **pfullname_local;
  char *path_local;
  char *name_local;
  
  pfullname_local = (char **)path;
  if (path != (char *)0x0) {
    while (pfullname_local != (char **)0x0) {
      pcVar1 = strchr((char *)pfullname_local,0x3a);
      if (pcVar1 == (char *)0x0) {
        fullname = (char *)strlen((char *)pfullname_local);
        plen = 0;
      }
      else {
        fullname = pcVar1 + -(long)pfullname_local;
        plen = (size_t)(pcVar1 + 1);
      }
      if (fullname != (char *)0x0) {
        sVar2 = strlen(name);
        pcVar1 = (char *)malloc((size_t)(fullname + sVar2 + 2));
        strncpy(pcVar1,(char *)pfullname_local,(size_t)fullname);
        pcVar1[(long)fullname] = '/';
        (pcVar1 + 1)[(long)fullname] = '\0';
        strcat(pcVar1,name);
        pFVar3 = fopen(pcVar1,"r");
        if (pFVar3 != (FILE *)0x0) {
          if (pfullname == (char **)0x0) {
            free(pcVar1);
            return (FILE *)pFVar3;
          }
          *pfullname = pcVar1;
          return (FILE *)pFVar3;
        }
        free(pcVar1);
      }
      pfullname_local = (char **)plen;
    }
  }
  return (FILE *)0x0;
}

Assistant:

FILE *find_in_path(const char *name, const char *path, char **pfullname) {
	if (!path)
		return 0;
	while (path) {
		const char *npath = strchr(path, ':');
		size_t plen;
		if (npath) {
			plen = npath - path;
			npath++;
		} else {
			plen = strlen(path);
		}
		if (plen) {
			char *fullname = malloc(strlen(name) + plen + 2);
			strncpy(fullname, path, plen);
			fullname[plen] = '/';
			fullname[plen+1] = 0;
			strcat(fullname, name);
			FILE *file = fopen(fullname, "r");
			if (file) {
				if (pfullname)
					*pfullname = fullname;
				else
					free(fullname);
				return file;
			}
			free(fullname);
		}
		path = npath;
	}
	return 0;
}